

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,WorldCoordinates *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"X: ",3);
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64X);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Y: ",6);
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64Y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Z: ",6);
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64Z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString WorldCoordinates::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f64X
       << ",  Y: " << m_f64Y
       << ",  Z: " << m_f64Z << "\n";

    return ss.str();
}